

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int av1_neg_interleave(int x,int ref,int max)

{
  int iVar1;
  int iVar2;
  
  if (ref == 0) {
    return x;
  }
  if (max + -1 <= ref) {
LAB_001819e9:
    return ~x + max;
  }
  iVar2 = x - ref;
  iVar1 = -iVar2;
  if (0 < iVar2) {
    iVar1 = iVar2;
  }
  if (ref * 2 < max) {
    if (ref < iVar1) {
      return x;
    }
  }
  else if (max - ref <= iVar1) goto LAB_001819e9;
  if (iVar2 < 1) {
    return iVar2 * -2;
  }
  return iVar2 * 2 + -1;
}

Assistant:

int av1_neg_interleave(int x, int ref, int max) {
  assert(x < max);
  const int diff = x - ref;
  if (!ref) return x;
  if (ref >= (max - 1)) return -x + max - 1;
  if (2 * ref < max) {
    if (abs(diff) <= ref) {
      if (diff > 0)
        return (diff << 1) - 1;
      else
        return ((-diff) << 1);
    }
    return x;
  } else {
    if (abs(diff) < (max - ref)) {
      if (diff > 0)
        return (diff << 1) - 1;
      else
        return ((-diff) << 1);
    }
    return (max - x) - 1;
  }
}